

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

_Bool string_no_case_compare(char *one,char *two)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  size_t sVar4;
  __int32_t **pp_Var5;
  long lVar6;
  
  if (two != (char *)0x0 && one != (char *)0x0) {
    sVar3 = strlen(one);
    sVar4 = strlen(two);
    if (sVar3 == sVar4) {
      lVar6 = 0;
      while( true ) {
        cVar1 = one[lVar6];
        if ((long)cVar1 == 0) {
          return true;
        }
        cVar2 = two[lVar6];
        if ((long)cVar2 == 0) {
          return true;
        }
        pp_Var5 = __ctype_tolower_loc();
        if ((*pp_Var5)[cVar1] != (*pp_Var5)[cVar2]) break;
        lVar6 = lVar6 + 1;
      }
    }
  }
  return false;
}

Assistant:

bool string_no_case_compare(const char *one, const char *two)
{
        if (one == NULL || two == NULL || (strlen(one) != strlen(two))) {
                return false;
        }

        char ch_one = '\0';
        char ch_two = '\0';

        while ((ch_one = *one) != '\0' && (ch_two = *two) != '\0') {
                if (tolower(ch_one) != tolower(ch_two)) {
                        return false;
                }

                ++one;
                ++two;
        }

        return true;
}